

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
writeDataTypeAttribute
          (UA_Server *server,UA_VariableNode *node,UA_NodeId *dataType,UA_NodeId *constraintDataType
          )

{
  undefined4 uVar1;
  UA_Boolean UVar2;
  undefined1 local_c8 [8];
  UA_NodeId dtCopy;
  undefined1 local_a8 [4];
  UA_StatusCode retval;
  UA_DataValue value;
  UA_NodeId subtypeId;
  UA_NodeId *constraintDataType_local;
  UA_NodeId *dataType_local;
  UA_VariableNode *node_local;
  UA_Server *server_local;
  
  if ((node->nodeClass == UA_NODECLASS_VARIABLETYPE) &&
     (UVar2 = UA_Node_hasSubTypeOrInstances((UA_Node *)node), UVar2)) {
    server_local._4_4_ = 0x80020000;
  }
  else {
    UA_NODEID_NUMERIC((UA_NodeId *)&value.serverPicoseconds,0,0x2d);
    UVar2 = isNodeInTree(server->nodestore,dataType,constraintDataType,
                         (UA_NodeId *)&value.serverPicoseconds,1);
    if (UVar2) {
      UA_DataValue_init((UA_DataValue *)local_a8);
      dtCopy.identifier._12_4_ = readValueAttribute(server,node,(UA_DataValue *)local_a8);
      server_local._4_4_ = dtCopy.identifier._12_4_;
      if (dtCopy.identifier._12_4_ == 0) {
        uVar1 = 0;
        if ((local_a8[0] & 1) != 0) {
          dtCopy.identifier._12_4_ =
               typeCheckValue(server,dataType,node->valueRank,node->arrayDimensionsSize,
                              node->arrayDimensions,(UA_Variant *)&value,(UA_NumericRange *)0x0,
                              (UA_Variant *)0x0);
          UA_DataValue_deleteMembers((UA_DataValue *)local_a8);
          uVar1 = dtCopy.identifier._12_4_;
          if (dtCopy.identifier._12_4_ != 0) {
            UA_LOG_DEBUG((server->config).logger,UA_LOGCATEGORY_SERVER,
                         "The current value does not match the new data type");
            return dtCopy.identifier._12_4_;
          }
        }
        dtCopy.identifier._12_4_ = uVar1;
        local_c8._0_2_ = (node->dataType).namespaceIndex;
        local_c8._2_2_ = *(undefined2 *)&(node->dataType).field_0x2;
        local_c8._4_4_ = (node->dataType).identifierType;
        dtCopy._0_8_ = (node->dataType).identifier.string.length;
        dtCopy.identifier.string.length = (size_t)(node->dataType).identifier.string.data;
        dtCopy.identifier._12_4_ = UA_NodeId_copy(dataType,&node->dataType);
        if (dtCopy.identifier._12_4_ == 0) {
          UA_NodeId_deleteMembers((UA_NodeId *)local_c8);
          server_local._4_4_ = 0;
        }
        else {
          (node->dataType).namespaceIndex = local_c8._0_2_;
          *(undefined2 *)&(node->dataType).field_0x2 = local_c8._2_2_;
          (node->dataType).identifierType = local_c8._4_4_;
          (node->dataType).identifier.string.length = dtCopy._0_8_;
          (node->dataType).identifier.string.data = (UA_Byte *)dtCopy.identifier.string.length;
          server_local._4_4_ = dtCopy.identifier._12_4_;
        }
      }
    }
    else {
      server_local._4_4_ = 0x80740000;
    }
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
writeDataTypeAttribute(UA_Server *server, UA_VariableNode *node,
                       const UA_NodeId *dataType, const UA_NodeId *constraintDataType) {
    /* If this is a variabletype, there must be no instances or subtypes of it
       when we do the change */
    if(node->nodeClass == UA_NODECLASS_VARIABLETYPE &&
       UA_Node_hasSubTypeOrInstances((const UA_Node*)node))
        return UA_STATUSCODE_BADINTERNALERROR;

    /* Does the new type match the constraints of the variabletype? */
    UA_NodeId subtypeId = UA_NODEID_NUMERIC(0, UA_NS0ID_HASSUBTYPE);
    if(!isNodeInTree(server->nodestore, dataType,
                     constraintDataType, &subtypeId, 1))
        return UA_STATUSCODE_BADTYPEMISMATCH;

    /* Check if the current value would match the new type */
    UA_DataValue value;
    UA_DataValue_init(&value);
    UA_StatusCode retval = readValueAttribute(server, node, &value);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;
    if(value.hasValue) {
        retval = typeCheckValue(server, dataType, node->valueRank,
                                node->arrayDimensionsSize, node->arrayDimensions,
                                &value.value, NULL, NULL);
        UA_DataValue_deleteMembers(&value);
        if(retval != UA_STATUSCODE_GOOD) {
            UA_LOG_DEBUG(server->config.logger, UA_LOGCATEGORY_SERVER,
                         "The current value does not match the new data type");
            return retval;
        }
    }

    /* Replace the datatype nodeid */
    UA_NodeId dtCopy = node->dataType;
    retval = UA_NodeId_copy(dataType, &node->dataType);
    if(retval != UA_STATUSCODE_GOOD) {
        node->dataType = dtCopy;
        return retval;
    }
    UA_NodeId_deleteMembers(&dtCopy);
    return UA_STATUSCODE_GOOD;
}